

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

int __thiscall IZDeflate::build_bl_tree(IZDeflate *this)

{
  int local_14;
  int max_blindex;
  IZDeflate *this_local;
  
  scan_tree(this,this->dyn_ltree,(this->l_desc).max_code);
  scan_tree(this,this->dyn_dtree,(this->d_desc).max_code);
  build_tree(this,&this->bl_desc);
  local_14 = 0x12;
  while ((2 < local_14 && (this->bl_tree[this->bl_order[local_14]].dl.dad == 0))) {
    local_14 = local_14 + -1;
  }
  this->opt_len = (long)((local_14 + 1) * 3 + 0xe) + this->opt_len;
  return local_14;
}

Assistant:

int IZDeflate::build_bl_tree()
{
    int max_blindex;  /* index of last bit length code of non zero freq */

    /* Determine the bit length frequencies for literal and distance trees */
    scan_tree((ct_data near *)dyn_ltree, l_desc.max_code);
    scan_tree((ct_data near *)dyn_dtree, d_desc.max_code);

    /* Build the bit length tree: */
    build_tree((tree_desc near *)(&bl_desc));
    /* opt_len now includes the length of the tree representations, except
     * the lengths of the bit lengths codes and the 5+5+4 bits for the counts.
     */

    /* Determine the number of bit length codes to send. The pkzip format
     * requires that at least 4 bit length codes be sent. (appnote.txt says
     * 3 but the actual value used is 4.)
     */
    for (max_blindex = BL_CODES-1; max_blindex >= 3; max_blindex--) {
        if (bl_tree[bl_order[max_blindex]].Len != 0) break;
    }
    /* Update opt_len to include the bit length tree and counts */
    opt_len += 3*(max_blindex+1) + 5+5+4;
    Tracev((stderr, "\ndyn trees: dyn %ld, stat %ld", opt_len, static_len));

    return max_blindex;
}